

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int patternTest(char *filename,char *resul,char *err,int options)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  FILE *__stream;
  char *pcVar6;
  FILE *__stream_00;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long *plVar11;
  long lVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  long lVar15;
  undefined8 uVar16;
  long lVar17;
  xmlChar *namespaces [22];
  char xml [500];
  char result [500];
  byte bStack_439;
  char str [1024];
  
  sVar5 = strlen(filename);
  sVar5 = (size_t)((int)sVar5 + -4);
  memcpy(xml,filename,sVar5);
  xml[sVar5] = '\0';
  baseFilename(xml);
  iVar1 = snprintf(result,499,"result/pattern/%s");
  if (0x1f2 < iVar1) {
    result[499] = '\0';
  }
  builtin_strncpy(xml + sVar5,".xml",5);
  iVar1 = checkTestFile(xml);
  if ((iVar1 == 0) && ((update_results & 1) == 0)) {
    pcVar6 = "Missing xml file %s\n";
    filename = xml;
  }
  else {
    __stream = fopen64(filename,"rb");
    if (__stream != (FILE *)0x0) {
      pcVar6 = resultFilename(filename,temp_directory,".res");
      if (pcVar6 == (char *)0x0) {
        fwrite("Out of memory\n",0xe,1,_stderr);
        fatalError();
      }
      __stream_00 = fopen64(pcVar6,"wb");
      if (__stream_00 == (FILE *)0x0) {
        fprintf(_stderr,"failed to open output file %s\n",pcVar6);
        fclose(__stream);
        free(pcVar6);
        return -1;
      }
      do {
        while( true ) {
          while( true ) {
            pcVar7 = fgets(str,0x3ff,__stream);
            if (pcVar7 == (char *)0x0) {
              fclose(__stream);
              fclose(__stream_00);
              iVar1 = compareFiles(pcVar6,result);
              if (iVar1 != 0) {
                fprintf(_stderr,"Result for %s failed in %s\n",filename,result);
              }
              unlink(pcVar6);
              free(pcVar6);
              return (uint)(iVar1 != 0);
            }
            sVar5 = strlen(str);
            uVar8 = sVar5 & 0xffffffff;
            while (((0 < (int)uVar8 && ((ulong)(byte)str[uVar8 - 1] < 0x21)) &&
                   ((0x100002600U >> ((ulong)(byte)str[uVar8 - 1] & 0x3f) & 1) != 0))) {
              str[uVar8 - 1] = '\0';
              uVar8 = uVar8 - 1;
            }
            lVar9 = xmlReadFile(xml,0,options);
            if (lVar9 != 0) break;
            fprintf(_stderr,"Failed to parse %s\n",xml);
          }
          lVar10 = xmlDocGetRootElement(lVar9);
          plVar11 = (long *)(lVar10 + 0x60);
          for (uVar8 = 0; (plVar11 = (long *)*plVar11, plVar11 != (long *)0x0 && (uVar8 < 0x14));
              uVar8 = uVar8 + 2) {
            namespaces[uVar8] = (xmlChar *)plVar11[2];
            namespaces[uVar8 + 1] = (xmlChar *)plVar11[3];
          }
          namespaces[uVar8] = (xmlChar *)0x0;
          namespaces[uVar8 + 1] = (xmlChar *)0x0;
          pcVar7 = str;
          lVar10 = xmlPatterncompile(str,*(undefined8 *)(lVar9 + 0x98),0);
          if (lVar10 != 0) break;
          testErrorHandler(pcVar7,"Pattern %s failed to compile\n",str);
          xmlFreeDoc(lVar9);
        }
        lVar12 = xmlPatternGetStreamCtxt(lVar10);
        if (lVar12 == 0) {
LAB_0010ae36:
          lVar12 = 0;
        }
        else {
          iVar1 = xmlStreamPush(lVar12,0,0);
          if (iVar1 < 0) {
            fwrite("xmlStreamPush() failure\n",0x18,1,_stderr);
            xmlFreeStreamCtxt(lVar12);
            goto LAB_0010ae36;
          }
        }
        nb_tests = nb_tests + 1;
        uVar13 = xmlReaderWalker(lVar9);
        iVar1 = xmlTextReaderRead(uVar13);
        while (iVar1 == 1) {
          iVar1 = xmlTextReaderNodeType(uVar13);
          iVar2 = xmlTextReaderIsEmptyElement(uVar13);
          lVar17 = lVar12;
          if (iVar1 == 1) {
            uVar14 = xmlTextReaderCurrentNode(uVar13);
            iVar3 = xmlPatternMatch(lVar10,uVar14);
            if (iVar3 == 0) {
              lVar15 = 0;
            }
            else {
              uVar14 = xmlTextReaderCurrentNode(uVar13);
              lVar15 = xmlGetNodePath(uVar14);
              fprintf(__stream_00,"Node %s matches pattern %s\n",lVar15);
            }
            if (lVar12 != 0) {
              uVar14 = xmlTextReaderConstLocalName(uVar13);
              uVar16 = xmlTextReaderConstNamespaceUri(uVar13);
              iVar4 = xmlStreamPush(lVar12,uVar14,uVar16);
              if (iVar4 < 0) {
                fwrite("xmlStreamPush() failure\n",0x18,1,__stream_00);
                xmlFreeStreamCtxt(lVar12);
                lVar17 = 0;
              }
              else if (iVar4 != iVar3) {
                if (lVar15 == 0) {
                  uVar14 = xmlTextReaderCurrentNode(uVar13);
                  lVar15 = xmlGetNodePath(uVar14);
                }
                fwrite("xmlPatternMatch and xmlStreamPush disagree\n",0x2b,1,__stream_00);
                fprintf(__stream_00,"  pattern %s node %s\n",str,lVar15);
              }
LAB_0010afa3:
              if (((iVar1 == 0xf) || (iVar1 == 1 && iVar2 != 0)) &&
                 (iVar1 = xmlStreamPop(lVar17), iVar1 < 0)) {
                fwrite("xmlStreamPop() failure\n",0x17,1,__stream_00);
                xmlFreeStreamCtxt(lVar17);
              }
            }
            if (lVar15 != 0) {
              (*_xmlFree)(lVar15);
            }
          }
          else if (lVar12 != 0) {
            lVar15 = 0;
            goto LAB_0010afa3;
          }
          iVar1 = xmlTextReaderRead(uVar13);
        }
        if (iVar1 != 0) {
          fprintf(__stream_00,"%s : failed to parse\n",filename);
        }
        xmlFreeTextReader(uVar13);
        xmlFreeDoc(lVar9);
        xmlFreeStreamCtxt(lVar12);
        xmlFreePattern(lVar10);
      } while( true );
    }
    pcVar6 = "Failed to open %s\n";
  }
  fprintf(_stderr,pcVar6,filename);
  return -1;
}

Assistant:

static int
patternTest(const char *filename,
            const char *resul ATTRIBUTE_UNUSED,
            const char *err ATTRIBUTE_UNUSED,
            int options) {
    xmlPatternPtr patternc = NULL;
    xmlStreamCtxtPtr patstream = NULL;
    FILE *o, *f;
    char str[1024];
    char xml[500];
    char result[500];
    int len, i;
    int ret = 0, res;
    char *temp;
    xmlTextReaderPtr reader;
    xmlDocPtr doc;

    len = strlen(filename);
    len -= 4;
    memcpy(xml, filename, len);
    xml[len] = 0;
    if (snprintf(result, 499, "result/pattern/%s", baseFilename(xml)) >= 499)
        result[499] = 0;
    memcpy(xml + len, ".xml", 5);

    if (!checkTestFile(xml) && !update_results) {
	fprintf(stderr, "Missing xml file %s\n", xml);
	return(-1);
    }
    f = fopen(filename, "rb");
    if (f == NULL) {
        fprintf(stderr, "Failed to open %s\n", filename);
	return(-1);
    }
    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    o = fopen(temp, "wb");
    if (o == NULL) {
	fprintf(stderr, "failed to open output file %s\n", temp);
	fclose(f);
        free(temp);
	return(-1);
    }
    while (1) {
	/*
	 * read one line in string buffer.
	 */
	if (fgets (&str[0], sizeof (str) - 1, f) == NULL)
	   break;

	/*
	 * remove the ending spaces
	 */
	i = strlen(str);
	while ((i > 0) &&
	       ((str[i - 1] == '\n') || (str[i - 1] == '\r') ||
		(str[i - 1] == ' ') || (str[i - 1] == '\t'))) {
	    i--;
	    str[i] = 0;
	}
	doc = xmlReadFile(xml, NULL, options);
	if (doc == NULL) {
	    fprintf(stderr, "Failed to parse %s\n", xml);
	    ret = 1;
	} else {
	    xmlNodePtr root;
	    const xmlChar *namespaces[22];
	    int j;
	    xmlNsPtr ns;

	    root = xmlDocGetRootElement(doc);
	    for (ns = root->nsDef, j = 0;ns != NULL && j < 20;ns=ns->next) {
		namespaces[j++] = ns->href;
		namespaces[j++] = ns->prefix;
	    }
	    namespaces[j++] = NULL;
	    namespaces[j] = NULL;

	    patternc = xmlPatterncompile((const xmlChar *) str, doc->dict,
					 0, &namespaces[0]);
	    if (patternc == NULL) {
		testErrorHandler(NULL,
			"Pattern %s failed to compile\n", str);
		xmlFreeDoc(doc);
		ret = 1;
		continue;
	    }
	    patstream = xmlPatternGetStreamCtxt(patternc);
	    if (patstream != NULL) {
		ret = xmlStreamPush(patstream, NULL, NULL);
		if (ret < 0) {
		    fprintf(stderr, "xmlStreamPush() failure\n");
		    xmlFreeStreamCtxt(patstream);
		    patstream = NULL;
		}
	    }
	    nb_tests++;

	    reader = xmlReaderWalker(doc);
	    res = xmlTextReaderRead(reader);
	    while (res == 1) {
		patternNode(o, reader, str, patternc, patstream);
		res = xmlTextReaderRead(reader);
	    }
	    if (res != 0) {
		fprintf(o, "%s : failed to parse\n", filename);
	    }
	    xmlFreeTextReader(reader);
	    xmlFreeDoc(doc);
	    xmlFreeStreamCtxt(patstream);
	    patstream = NULL;
	    xmlFreePattern(patternc);

	}
    }

    fclose(f);
    fclose(o);

    ret = compareFiles(temp, result);
    if (ret) {
	fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	ret = 1;
    }
    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }
    return(ret);
}